

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

void duckdb::RoundDecimalOperator::Operation<short,duckdb::NumericHelper>
               (DataChunk *input,uint8_t scale,Vector *result)

{
  reference input_00;
  undefined7 in_register_00000031;
  short addition;
  short power_of_ten;
  undefined2 local_34;
  short local_32;
  undefined2 *local_30;
  short *local_28;
  
  local_32 = *(short *)(NumericHelper::POWERS_OF_TEN +
                       (CONCAT71(in_register_00000031,scale) & 0xffffffff) * 8);
  local_34 = (undefined2)((uint)(int)(short)(local_32 - (local_32 >> 0xf)) >> 1);
  input_00 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
  local_30 = &local_34;
  local_28 = &local_32;
  UnaryExecutor::
  ExecuteStandard<short,short,duckdb::UnaryLambdaWrapper,duckdb::RoundDecimalOperator::Operation<short,duckdb::NumericHelper>(duckdb::DataChunk&,unsigned_char,duckdb::Vector&)::_lambda(short)_1_>
            (input_00,result,input->count,&local_30,false,CAN_THROW_RUNTIME_ERROR);
  return;
}

Assistant:

static void Operation(DataChunk &input, uint8_t scale, Vector &result) {
		T power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[scale]);
		T addition = power_of_ten / 2;
		// regular round rounds towards the nearest number
		// in case of a tie we round away from zero
		// i.e. -10.5 -> -11, 10.5 -> 11
		// we implement this by adding (positive) or subtracting (negative) 0.5
		// and then flooring the number
		// e.g. 10.5 + 0.5 = 11, floor(11) = 11
		//      10.4 + 0.5 = 10.9, floor(10.9) = 10
		UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
			if (input < 0) {
				input -= addition;
			} else {
				input += addition;
			}
			return UnsafeNumericCast<T>(input / power_of_ten);
		});
	}